

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O1

string * __thiscall
t_php_generator::php_namespace_suffix_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_program *p)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  string ns;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  php_namespace_base_abi_cxx11_(&local_48,this,p);
  sVar1 = (this->nsglobal_)._M_string_length;
  local_88[0] = local_78;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  }
  else {
    pcVar2 = (this->nsglobal_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_88,pcVar2,pcVar2 + sVar1);
  }
  if (local_48._M_string_length != 0) {
    sVar1 = (this->nsglobal_)._M_string_length;
    local_a8[0] = local_98;
    if (sVar1 == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
    }
    else {
      pcVar2 = (this->nsglobal_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)local_a8,pcVar2,pcVar2 + sVar1);
    }
  }
  plVar4 = (long *)std::__cxx11::string::append((char *)local_88);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if ((local_48._M_string_length != 0) && (local_a8[0] != local_98)) {
    operator_delete(local_a8[0]);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string php_namespace_suffix(const t_program* p) {
    string ns = php_namespace_base(p);

    return NSGLOBAL
      + (ns.size() && NSGLOBAL.size() ? "\\" : "")
      + ns;
  }